

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O2

void __thiscall chrono::ChAparticle::ComputeJacobianForContactPart(ChAparticle *this)

{
  type_constraint_tuple *in_RCX;
  ChMatrix33<double> *in_RDX;
  ChVector<double> *in_RSI;
  type_constraint_tuple *in_R8;
  type_constraint_tuple *in_R9;
  bool in_stack_00000008;
  
  ComputeJacobianForContactPart
            ((ChAparticle *)
             (this[-1].super_ChParticleBase.super_ChFrameMoving<double>.coord_dt.rot.m_data + 1),
             in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008);
  return;
}

Assistant:

void ChAparticle::ComputeJacobianForContactPart(
    const ChVector<>& abs_point,
    ChMatrix33<>& contact_plane,
    ChVariableTupleCarrier_1vars<6>::type_constraint_tuple& jacobian_tuple_N,
    ChVariableTupleCarrier_1vars<6>::type_constraint_tuple& jacobian_tuple_U,
    ChVariableTupleCarrier_1vars<6>::type_constraint_tuple& jacobian_tuple_V,
    bool second) {
    ChVector<> m_p1_loc = this->TransformPointParentToLocal(abs_point);

    ChMatrix33<> Jx1 = contact_plane.transpose();
    if (!second)
        Jx1 *= -1;
    
    ChStarMatrix33<> Ps1(m_p1_loc);
    ChMatrix33<> Jr1 = contact_plane.transpose() * GetA() * Ps1;
    if (second)
        Jr1 *= -1;

    jacobian_tuple_N.Get_Cq().segment(0, 3) = Jx1.row(0);
    jacobian_tuple_U.Get_Cq().segment(0, 3) = Jx1.row(1);
    jacobian_tuple_V.Get_Cq().segment(0, 3) = Jx1.row(2);

    jacobian_tuple_N.Get_Cq().segment(3, 3) = Jr1.row(0);
    jacobian_tuple_U.Get_Cq().segment(3, 3) = Jr1.row(1);
    jacobian_tuple_V.Get_Cq().segment(3, 3) = Jr1.row(2);
}